

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.cc
# Opt level: O2

size_t xemmai::t_type_of<xemmai::t_tuple>::f_do_get_at(t_object *a_this,t_pvalue *a_stack)

{
  t_object *ptVar1;
  t_svalue *ptVar2;
  anon_union_8_2_8dc3d723_for_t_value<xemmai::t_pointer>_2 *paVar3;
  
  f_check<unsigned_long>(a_stack[2].super_t_pointer.v_p,L"index");
  ptVar1 = a_stack[2].super_t_pointer.v_p;
  paVar3 = (anon_union_8_2_8dc3d723_for_t_value<xemmai::t_pointer>_2 *)ptVar1->v_data;
  if (ptVar1 < (t_object *)0x5) {
    paVar3 = &a_stack[2].field_0;
  }
  ptVar2 = t_tuple::f_get_at((t_tuple *)a_this->v_data,paVar3->v_integer);
  (a_stack->super_t_pointer).v_p = (ptVar2->super_t_slot).v_p._M_b._M_p;
  a_stack->field_0 = (anon_union_8_2_8dc3d723_for_t_value<xemmai::t_pointer>_2)ptVar2->field_0;
  return 0xffffffffffffffff;
}

Assistant:

size_t t_type_of<t_tuple>::f_do_get_at(t_object* a_this, t_pvalue* a_stack)
{
	f_check<size_t>(a_stack[2], L"index");
	a_stack[0] = a_this->f_as<t_tuple>().f_get_at(f_as<size_t>(a_stack[2]));
	return -1;
}